

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayIndexStaticEnumerator.h
# Opt level: O3

bool __thiscall
Js::ES5ArrayIndexStaticEnumerator<true>::MoveNext
          (ES5ArrayIndexStaticEnumerator<true> *this,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  uint uVar8;
  uint uVar9;
  PropertyAttributes PVar10;
  
  uVar6 = this->m_index;
  uVar3 = this->m_dataIndex;
  uVar8 = this->m_descriptorIndex;
  if (uVar3 < this->m_descriptorIndex) {
    uVar8 = uVar3;
  }
  if (uVar6 != uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ES5ArrayIndexStaticEnumerator.h"
                                ,0x3e,"(m_index == min(m_dataIndex, m_descriptorIndex))",
                                "m_index == min(m_dataIndex, m_descriptorIndex)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    uVar6 = this->m_index;
    uVar3 = this->m_dataIndex;
  }
  if (uVar6 == uVar3) {
    uVar4 = JavascriptArray::GetNextIndex(&this->m_array->super_JavascriptArray,uVar3);
    this->m_dataIndex = uVar4;
    uVar6 = this->m_index;
  }
  if (uVar6 != this->m_descriptorIndex) {
    BVar5 = ES5Array::IsValidDescriptorToken(this->m_array,this->m_descriptorValidationToken);
    if (BVar5 != 0) {
      uVar6 = this->m_descriptorIndex;
      goto LAB_00ba33ef;
    }
    uVar6 = this->m_index;
  }
  uVar6 = ES5Array::GetNextDescriptor
                    (this->m_array,uVar6,&this->m_descriptor,&this->m_descriptorValidationToken);
  this->m_descriptorIndex = uVar6;
LAB_00ba33ef:
  uVar3 = this->m_initialLength;
  uVar8 = this->m_dataIndex;
  uVar9 = uVar6;
  if (uVar8 < uVar6) {
    uVar9 = uVar8;
  }
  this->m_index = uVar9;
  if ((attributes != (PropertyAttributes *)0x0) && (uVar9 < uVar3)) {
    PVar10 = '\x01';
    if (uVar6 <= uVar8) {
      PVar10 = this->m_descriptor->Attributes;
    }
    *attributes = PVar10;
  }
  return uVar9 < uVar3;
}

Assistant:

bool MoveNext(PropertyAttributes* attributes = nullptr)
        {
            while (true)
            {
                Assert(m_index == min(m_dataIndex, m_descriptorIndex));
                if (m_index == m_dataIndex)
                {
                    m_dataIndex = m_array->GetNextIndex(m_dataIndex);
                }
                if (m_index == m_descriptorIndex || !m_array->IsValidDescriptorToken(m_descriptorValidationToken))
                {
                    m_descriptorIndex = m_array->GetNextDescriptor(m_index, &m_descriptor, &m_descriptorValidationToken);
                }

                m_index = min(m_dataIndex, m_descriptorIndex);
                if (m_index >= m_initialLength) // End of array
                {
                    break;
                }

                if (enumNonEnumerable
                    || m_index < m_descriptorIndex
                    || (m_descriptor->Attributes & PropertyEnumerable))
                {
                    if (attributes != nullptr)
                    {
                        if (m_index < m_descriptorIndex)
                        {
                            *attributes = PropertyEnumerable;
                        }
                        else
                        {
                            *attributes = m_descriptor->Attributes;
                        }
                    }

                    return true;
                }
            }

            return false;
        }